

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.hpp
# Opt level: O0

void __thiscall nite::Program::Program(Program *this,int id,string *name,Shader *ref)

{
  Shader *ref_local;
  string *name_local;
  int id_local;
  Program *this_local;
  
  std::__cxx11::string::string((string *)this);
  Uniform::Uniform(&this->uniforms);
  this->id = id;
  std::__cxx11::string::operator=((string *)this,(string *)name);
  this->ref = ref;
  return;
}

Assistant:

Program(int id, const String &name, nite::Shader *ref){
				this->id = id;
				this->shaderName = name;
				this->ref = ref;
			}